

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.c
# Opt level: O1

_Bool apprun_is_path_child_of(char *path,char *base)

{
  int iVar1;
  char *__s;
  char *__ptr;
  ulong uVar2;
  
  __s = realpath(base,(char *)0x0);
  __ptr = realpath(path,(char *)0x0);
  if (__ptr == (char *)0x0 || __s == (char *)0x0) {
    uVar2 = strlen(base);
  }
  else {
    uVar2 = strlen(__s);
    path = __ptr;
    base = __s;
  }
  iVar1 = strncmp(base,path,uVar2 & 0xffffffff);
  if (__s != (char *)0x0) {
    free(__s);
  }
  if (__ptr != (char *)0x0) {
    free(__ptr);
  }
  return iVar1 == 0;
}

Assistant:

bool apprun_is_path_child_of(const char *path, const char *base) {
    char *real_base = realpath(base, NULL);
    char *real_path = realpath(path, NULL);

    bool result;

    if (real_base != NULL && real_path != NULL) {
        unsigned int len = strlen(real_base);
        result = strncmp(real_base, real_path, len) == 0;
    } else {
        unsigned int len = strlen(base);
        result = strncmp(base, path, len) == 0;
    }

    if (real_base)
        free(real_base);

    if (real_path)
        free(real_path);
#ifdef DEBUG
    fprintf(stderr, "APPRUN_DEBUG: is %s child of %s:  %d\n", path, base, result);
#endif
    return result;
}